

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipartExamples.cpp
# Opt level: O2

void modifyMultipart(void)

{
  pointer pHVar1;
  __type _Var2;
  int iVar3;
  int iVar4;
  int iVar5;
  Header *pHVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  int iVar7;
  int i;
  long lVar8;
  long lVar9;
  long local_160;
  list<Imf_3_4::Array2D<unsigned_int>,_std::allocator<Imf_3_4::Array2D<unsigned_int>_>_> intChannels
  ;
  list<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_> floatChannels;
  list<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
  halfChannels;
  MultiPartOutputFile outputFile;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> headers;
  MultiPartInputFile inputFile;
  InputPart inputPart;
  FrameBuffer frameBuffer;
  DeepScanLineInputPart inputPart_2;
  
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartInputFile::MultiPartInputFile(&inputFile,"multipart.exr",iVar3,true);
  iVar3 = Imf_3_4::MultiPartInputFile::parts();
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::vector
            (&headers,(long)iVar3,(allocator_type *)&frameBuffer);
  lVar9 = 0;
  lVar8 = 0;
  while( true ) {
    iVar3 = Imf_3_4::MultiPartInputFile::parts();
    pHVar1 = headers.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar3 <= lVar8) break;
    pHVar6 = (Header *)Imf_3_4::MultiPartInputFile::header((int)&inputFile);
    Imf_3_4::Header::operator=
              (headers.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl
               .super__Vector_impl_data._M_start + lVar9,pHVar6);
    lVar8 = lVar8 + 1;
    lVar9 = lVar9 + 0x38;
  }
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
            (&outputFile,"modified.exr",pHVar1,
             (int)(((long)headers.
                          super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pHVar1) / 0x38),false,
             iVar3);
  lVar8 = 0;
  local_160 = 0;
  do {
    iVar3 = Imf_3_4::MultiPartInputFile::parts();
    if (iVar3 <= local_160) {
      Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile(&outputFile);
      std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector(&headers);
      Imf_3_4::MultiPartInputFile::~MultiPartInputFile(&inputFile);
      return;
    }
    pHVar6 = headers.super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
             super__Vector_impl_data._M_start + lVar8;
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            Imf_3_4::Header::type_abi_cxx11_();
    _Var2 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)Imf_3_4::SCANLINEIMAGE_abi_cxx11_);
    iVar3 = (int)local_160;
    if (_Var2) {
LAB_0010f52f:
      intChannels.
      super__List_base<Imf_3_4::Array2D<unsigned_int>,_std::allocator<Imf_3_4::Array2D<unsigned_int>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&intChannels;
      intChannels.
      super__List_base<Imf_3_4::Array2D<unsigned_int>,_std::allocator<Imf_3_4::Array2D<unsigned_int>_>_>
      ._M_impl._M_node._M_size = 0;
      halfChannels.
      super__List_base<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&halfChannels;
      halfChannels.
      super__List_base<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
      ._M_impl._M_node._M_size = 0;
      floatChannels.
      super__List_base<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_>._M_impl.
      _M_node.super__List_node_base._M_next = (_List_node_base *)&floatChannels;
      floatChannels.
      super__List_base<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_>._M_impl.
      _M_node._M_size = 0;
      intChannels.
      super__List_base<Imf_3_4::Array2D<unsigned_int>,_std::allocator<Imf_3_4::Array2D<unsigned_int>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev =
           intChannels.
           super__List_base<Imf_3_4::Array2D<unsigned_int>,_std::allocator<Imf_3_4::Array2D<unsigned_int>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
      floatChannels.
      super__List_base<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_>._M_impl.
      _M_node.super__List_node_base._M_prev =
           floatChannels.
           super__List_base<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_>.
           _M_impl._M_node.super__List_node_base._M_next;
      halfChannels.
      super__List_base<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev =
           halfChannels.
           super__List_base<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
      setupFramebuffer(&frameBuffer,pHVar6,
                       (list<Imf_3_4::Array2D<unsigned_int>,_std::allocator<Imf_3_4::Array2D<unsigned_int>_>_>
                        *)intChannels.
                          super__List_base<Imf_3_4::Array2D<unsigned_int>,_std::allocator<Imf_3_4::Array2D<unsigned_int>_>_>
                          ._M_impl._M_node.super__List_node_base._M_next,
                       (list<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
                        *)halfChannels.
                          super__List_base<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
                          ._M_impl._M_node.super__List_node_base._M_next,
                       (list<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_> *)
                       floatChannels.
                       super__List_base<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_>
                       ._M_impl._M_node.super__List_node_base._M_next);
      _Var2 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)Imf_3_4::SCANLINEIMAGE_abi_cxx11_);
      iVar7 = (int)&inputPart;
      if (_Var2) {
        Imf_3_4::InputPart::InputPart(&inputPart,&inputFile,iVar3);
        Imf_3_4::InputPart::setFrameBuffer((FrameBuffer *)&inputPart);
        lVar9 = Imf_3_4::Header::dataWindow();
        iVar5 = *(int *)(lVar9 + 4);
        Imf_3_4::Header::dataWindow();
        Imf_3_4::InputPart::readPixels(iVar7,iVar5);
      }
      else {
        Imf_3_4::TiledInputPart::TiledInputPart((TiledInputPart *)&inputPart,&inputFile,iVar3);
        Imf_3_4::TiledInputPart::setFrameBuffer((FrameBuffer *)&inputPart);
        iVar5 = Imf_3_4::TiledInputPart::numXTiles(iVar7);
        iVar4 = Imf_3_4::TiledInputPart::numYTiles(iVar7);
        Imf_3_4::TiledInputPart::readTiles(iVar7,0,iVar5 + -1,0,iVar4 + -1);
      }
      modifyChannels<unsigned_int>(&intChannels,1);
      modifyChannels<Imath_3_2::half>(&halfChannels,(half)0x34cd);
      modifyChannels<float>(&floatChannels,0.5);
      _Var2 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)Imf_3_4::SCANLINEIMAGE_abi_cxx11_);
      if (_Var2) {
        Imf_3_4::Header::dataWindow();
        Imf_3_4::OutputPart::OutputPart((OutputPart *)&inputPart,&outputFile,iVar3);
        Imf_3_4::OutputPart::setFrameBuffer((FrameBuffer *)&inputPart);
        Imf_3_4::OutputPart::writePixels(iVar7);
      }
      else {
        Imf_3_4::TiledOutputPart::TiledOutputPart((TiledOutputPart *)&inputPart,&outputFile,iVar3);
        Imf_3_4::TiledOutputPart::setFrameBuffer((FrameBuffer *)&inputPart);
        iVar3 = Imf_3_4::TiledOutputPart::numXTiles(iVar7);
        iVar5 = Imf_3_4::TiledOutputPart::numYTiles(iVar7);
        Imf_3_4::TiledOutputPart::writeTiles(iVar7,0,iVar3 + -1,0,iVar5 + -1);
      }
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&frameBuffer);
      std::__cxx11::_List_base<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_>::
      _M_clear(&floatChannels.
                super__List_base<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_>
              );
      std::__cxx11::
      _List_base<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
      ::_M_clear(&halfChannels.
                  super__List_base<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
                );
      std::__cxx11::
      _List_base<Imf_3_4::Array2D<unsigned_int>,_std::allocator<Imf_3_4::Array2D<unsigned_int>_>_>::
      _M_clear(&intChannels.
                super__List_base<Imf_3_4::Array2D<unsigned_int>,_std::allocator<Imf_3_4::Array2D<unsigned_int>_>_>
              );
    }
    else {
      _Var2 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)Imf_3_4::TILEDIMAGE_abi_cxx11_);
      if (_Var2) goto LAB_0010f52f;
      _Var2 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)Imf_3_4::DEEPSCANLINE_abi_cxx11_);
      if (_Var2) {
LAB_0010f773:
        intChannels.
        super__List_base<Imf_3_4::Array2D<unsigned_int>,_std::allocator<Imf_3_4::Array2D<unsigned_int>_>_>
        ._M_impl._M_node._M_size = 0;
        halfChannels.
        super__List_base<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
        ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&halfChannels;
        halfChannels.
        super__List_base<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
        ._M_impl._M_node._M_size = 0;
        intChannels.
        super__List_base<Imf_3_4::Array2D<unsigned_int>,_std::allocator<Imf_3_4::Array2D<unsigned_int>_>_>
        ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
        intChannels.
        super__List_base<Imf_3_4::Array2D<unsigned_int>,_std::allocator<Imf_3_4::Array2D<unsigned_int>_>_>
        ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
        floatChannels.
        super__List_base<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_>._M_impl
        ._M_node.super__List_node_base._M_next = (_List_node_base *)&floatChannels;
        floatChannels.
        super__List_base<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_>._M_impl
        ._M_node._M_size = 0;
        floatChannels.
        super__List_base<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_>._M_impl
        ._M_node.super__List_node_base._M_prev =
             floatChannels.
             super__List_base<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_>.
             _M_impl._M_node.super__List_node_base._M_next;
        halfChannels.
        super__List_base<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
        ._M_impl._M_node.super__List_node_base._M_prev =
             halfChannels.
             super__List_base<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
        _inputPart = &inputPart;
        setupDeepFramebuffer
                  ((DeepFrameBuffer *)&frameBuffer,pHVar6,(Array2D<unsigned_int> *)&intChannels,
                   (list<Imf_3_4::Array2D<unsigned_int_*>,_std::allocator<Imf_3_4::Array2D<unsigned_int_*>_>_>
                    *)halfChannels.
                      super__List_base<Imf_3_4::Array2D<Imath_3_2::half>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half>_>_>
                      ._M_impl._M_node.super__List_node_base._M_next,
                   (list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
                    *)floatChannels.
                      super__List_base<Imf_3_4::Array2D<float>,_std::allocator<Imf_3_4::Array2D<float>_>_>
                      ._M_impl._M_node.super__List_node_base._M_next,
                   (list<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_> *)
                   &inputPart);
        _Var2 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)Imf_3_4::DEEPSCANLINE_abi_cxx11_);
        iVar7 = (int)(DeepFrameBuffer *)&inputPart_2;
        if (_Var2) {
          Imf_3_4::DeepScanLineInputPart::DeepScanLineInputPart(&inputPart_2,&inputFile,iVar3);
          Imf_3_4::DeepScanLineInputPart::setFrameBuffer((DeepFrameBuffer *)&inputPart_2);
          lVar9 = Imf_3_4::Header::dataWindow();
          iVar5 = *(int *)(lVar9 + 4);
          Imf_3_4::Header::dataWindow();
          Imf_3_4::DeepScanLineInputPart::readPixelSampleCounts(iVar7,iVar5);
          resizeDeepBuffers<unsigned_int>
                    ((Array2D<unsigned_int> *)&intChannels,
                     (list<Imf_3_4::Array2D<unsigned_int_*>,_std::allocator<Imf_3_4::Array2D<unsigned_int_*>_>_>
                      *)&halfChannels);
          resizeDeepBuffers<Imath_3_2::half>
                    ((Array2D<unsigned_int> *)&intChannels,
                     (list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
                      *)&floatChannels);
          resizeDeepBuffers<float>
                    ((Array2D<unsigned_int> *)&intChannels,
                     (list<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_> *
                     )&inputPart);
          lVar9 = Imf_3_4::Header::dataWindow();
          iVar5 = *(int *)(lVar9 + 4);
          Imf_3_4::Header::dataWindow();
          Imf_3_4::DeepScanLineInputPart::readPixels(iVar7,iVar5);
        }
        else {
          Imf_3_4::DeepTiledInputPart::DeepTiledInputPart
                    ((DeepTiledInputPart *)&inputPart_2,&inputFile,iVar3);
          Imf_3_4::DeepTiledInputPart::setFrameBuffer((DeepFrameBuffer *)&inputPart_2);
          iVar5 = Imf_3_4::DeepTiledInputPart::numXTiles(iVar7);
          iVar4 = Imf_3_4::DeepTiledInputPart::numYTiles(iVar7);
          Imf_3_4::DeepTiledInputPart::readPixelSampleCounts(iVar7,0,iVar5 + -1,0,iVar4 + -1);
          resizeDeepBuffers<unsigned_int>
                    ((Array2D<unsigned_int> *)&intChannels,
                     (list<Imf_3_4::Array2D<unsigned_int_*>,_std::allocator<Imf_3_4::Array2D<unsigned_int_*>_>_>
                      *)&halfChannels);
          resizeDeepBuffers<Imath_3_2::half>
                    ((Array2D<unsigned_int> *)&intChannels,
                     (list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
                      *)&floatChannels);
          resizeDeepBuffers<float>
                    ((Array2D<unsigned_int> *)&intChannels,
                     (list<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_> *
                     )&inputPart);
          iVar5 = Imf_3_4::DeepTiledInputPart::numXTiles(iVar7);
          iVar4 = Imf_3_4::DeepTiledInputPart::numYTiles(iVar7);
          Imf_3_4::DeepTiledInputPart::readTiles(iVar7,0,iVar5 + -1,0,iVar4 + -1);
        }
        modifyDeepChannels<unsigned_int>
                  ((Array2D<unsigned_int> *)&intChannels,
                   (list<Imf_3_4::Array2D<unsigned_int_*>,_std::allocator<Imf_3_4::Array2D<unsigned_int_*>_>_>
                    *)&halfChannels,1);
        modifyDeepChannels<Imath_3_2::half>
                  ((Array2D<unsigned_int> *)&intChannels,
                   (list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
                    *)&floatChannels,(half)0x34cd);
        modifyDeepChannels<float>
                  ((Array2D<unsigned_int> *)&intChannels,
                   (list<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_> *)
                   &inputPart,0.5);
        _Var2 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)Imf_3_4::DEEPSCANLINE_abi_cxx11_);
        if (_Var2) {
          Imf_3_4::Header::dataWindow();
          Imf_3_4::DeepScanLineOutputPart::DeepScanLineOutputPart
                    ((DeepScanLineOutputPart *)&inputPart_2,&outputFile,iVar3);
          Imf_3_4::DeepScanLineOutputPart::setFrameBuffer((DeepFrameBuffer *)&inputPart_2);
          Imf_3_4::DeepScanLineOutputPart::writePixels(iVar7);
        }
        else {
          Imf_3_4::DeepTiledOutputPart::DeepTiledOutputPart
                    ((DeepTiledOutputPart *)&inputPart_2,&outputFile,iVar3);
          Imf_3_4::DeepTiledOutputPart::setFrameBuffer((DeepFrameBuffer *)&inputPart_2);
          iVar3 = Imf_3_4::DeepTiledOutputPart::numXTiles(iVar7);
          iVar5 = Imf_3_4::DeepTiledOutputPart::numYTiles(iVar7);
          Imf_3_4::DeepTiledOutputPart::writeTiles(iVar7,0,iVar3 + -1,0,iVar5 + -1);
        }
        freeDeepBuffers<unsigned_int>
                  ((list<Imf_3_4::Array2D<unsigned_int_*>,_std::allocator<Imf_3_4::Array2D<unsigned_int_*>_>_>
                    *)&halfChannels);
        freeDeepBuffers<Imath_3_2::half>
                  ((list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
                    *)&floatChannels);
        freeDeepBuffers<float>
                  ((list<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_> *)
                   &inputPart);
        std::
        _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
        ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
                     *)&frameBuffer);
        std::__cxx11::
        _List_base<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_>::_M_clear
                  ((_List_base<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_>
                    *)&inputPart);
        std::__cxx11::
        _List_base<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
        ::_M_clear((_List_base<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
                    *)&floatChannels);
        std::__cxx11::
        _List_base<Imf_3_4::Array2D<unsigned_int_*>,_std::allocator<Imf_3_4::Array2D<unsigned_int_*>_>_>
        ::_M_clear((_List_base<Imf_3_4::Array2D<unsigned_int_*>,_std::allocator<Imf_3_4::Array2D<unsigned_int_*>_>_>
                    *)&halfChannels);
        Imf_3_4::Array2D<unsigned_int>::~Array2D((Array2D<unsigned_int> *)&intChannels);
      }
      else {
        _Var2 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)Imf_3_4::DEEPTILE_abi_cxx11_);
        if (_Var2) goto LAB_0010f773;
      }
    }
    local_160 = local_160 + 1;
    lVar8 = lVar8 + 0x38;
  } while( true );
}

Assistant:

void
modifyMultipart ()
{
    //
    // Read all channels from a multi-part file, modify each pixel value, write the modified data as a multi-part file.
    // The parts in the file can be scanline- or tile-based, either flat or deep.
    // Every channel of the input file gets modified.
    //

    MultiPartInputFile inputFile ("multipart.exr");

    std::vector<Header> headers (inputFile.parts ());

    for (int i = 0; i < inputFile.parts (); i++)
    {
        headers[i] = inputFile.header (i);
    }

    MultiPartOutputFile outputFile (
        "modified.exr", headers.data (), (int) headers.size ());

    for (int i = 0; i < inputFile.parts (); i++)
    {
        Header& header = headers[i];

        const string& type = header.type ();

        if (type == SCANLINEIMAGE || type == TILEDIMAGE)
        {
            list<Array2D<uint32_t>> intChannels;
            list<Array2D<half>>     halfChannels;
            list<Array2D<float>>    floatChannels;

            FrameBuffer frameBuffer = setupFramebuffer (
                header, intChannels, halfChannels, floatChannels);

            if (type == SCANLINEIMAGE)
            {
                InputPart inputPart (inputFile, i);
                inputPart.setFrameBuffer (frameBuffer);
                inputPart.readPixels (
                    header.dataWindow ().min.y, header.dataWindow ().max.y);
            }
            else
            {
                TiledInputPart inputPart (inputFile, i);
                inputPart.setFrameBuffer (frameBuffer);
                inputPart.readTiles (
                    0,
                    inputPart.numXTiles () - 1,
                    0,
                    inputPart.numYTiles () - 1);
            }

            modifyChannels<uint32_t> (intChannels, 1);
            modifyChannels<half> (halfChannels, 0.3);
            modifyChannels<float> (floatChannels, 0.5);

            if (type == SCANLINEIMAGE)
            {
                Box2i      dataWindow = header.dataWindow ();
                OutputPart outputPart (outputFile, i);
                outputPart.setFrameBuffer (frameBuffer);
                outputPart.writePixels (
                    dataWindow.max.y - dataWindow.min.y + 1);
            }
            else
            {
                TiledOutputPart outputPart (outputFile, i);
                outputPart.setFrameBuffer (frameBuffer);
                outputPart.writeTiles (
                    0,
                    outputPart.numXTiles () - 1,
                    0,
                    outputPart.numYTiles () - 1);
            }
        }
        else if (type == DEEPSCANLINE || type == DEEPTILE)
        {
            Array2D<uint32_t>        sampleCount;
            list<Array2D<uint32_t*>> intChannels;
            list<Array2D<half*>>     halfChannels;
            list<Array2D<float*>>    floatChannels;

            DeepFrameBuffer frameBuffer = setupDeepFramebuffer (
                header, sampleCount, intChannels, halfChannels, floatChannels);

            if (type == DEEPSCANLINE)
            {
                DeepScanLineInputPart inputPart (inputFile, i);
                inputPart.setFrameBuffer (frameBuffer);
                inputPart.readPixelSampleCounts (
                    header.dataWindow ().min.y, header.dataWindow ().max.y);

                resizeDeepBuffers<uint32_t> (sampleCount, intChannels);
                resizeDeepBuffers<half> (sampleCount, halfChannels);
                resizeDeepBuffers<float> (sampleCount, floatChannels);

                inputPart.readPixels (
                    header.dataWindow ().min.y, header.dataWindow ().max.y);
            }
            else
            {
                DeepTiledInputPart inputPart (inputFile, i);
                inputPart.setFrameBuffer (frameBuffer);
                inputPart.readPixelSampleCounts (
                    0,
                    inputPart.numXTiles () - 1,
                    0,
                    inputPart.numYTiles () - 1);

                resizeDeepBuffers<uint32_t> (sampleCount, intChannels);
                resizeDeepBuffers<half> (sampleCount, halfChannels);
                resizeDeepBuffers<float> (sampleCount, floatChannels);

                inputPart.readTiles (
                    0,
                    inputPart.numXTiles () - 1,
                    0,
                    inputPart.numYTiles () - 1);
            }

            modifyDeepChannels<uint32_t> (sampleCount, intChannels, 1);
            modifyDeepChannels<half> (sampleCount, halfChannels, 0.3);
            modifyDeepChannels<float> (sampleCount, floatChannels, 0.5);

            if (type == DEEPSCANLINE)
            {
                Box2i                  dataWindow = header.dataWindow ();
                DeepScanLineOutputPart outputPart (outputFile, i);
                outputPart.setFrameBuffer (frameBuffer);
                outputPart.writePixels (
                    dataWindow.max.y - dataWindow.min.y + 1);
            }
            else
            {
                DeepTiledOutputPart outputPart (outputFile, i);
                outputPart.setFrameBuffer (frameBuffer);
                outputPart.writeTiles (
                    0,
                    outputPart.numXTiles () - 1,
                    0,
                    outputPart.numYTiles () - 1);
            }

            freeDeepBuffers (intChannels);
            freeDeepBuffers (halfChannels);
            freeDeepBuffers (floatChannels);
        }
    }
}